

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PythonDataType.h
# Opt level: O3

Ref<anurbs::Polyline<2L>_> __thiscall
anurbs::PythonDataType<anurbs::Model,_anurbs::Polyline<2L>_>::replace_with_key
          (PythonDataType<anurbs::Model,_anurbs::Polyline<2L>_> *this,Model *self,string *key,
          Pointer<anurbs::Polyline<2L>_> *data)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  Ref<anurbs::Polyline<2L>_> RVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  
  this_00 = (data->super___shared_ptr<anurbs::Polyline<2L>,_(__gnu_cxx::_Lock_policy)2>)._M_refcount
            ._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
  }
  RVar2 = Model::replace<anurbs::Polyline<2l>>
                    ((Model *)this,(string *)self,(Pointer<anurbs::Polyline<2L>_> *)key);
  _Var1._M_pi = RVar2.m_entry.
                super___shared_ptr<anurbs::Entry<anurbs::Polyline<2L>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    _Var1._M_pi = extraout_RDX;
  }
  RVar2.m_entry.super___shared_ptr<anurbs::Entry<anurbs::Polyline<2L>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = _Var1._M_pi;
  RVar2.m_entry.super___shared_ptr<anurbs::Entry<anurbs::Polyline<2L>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)this;
  return (Ref<anurbs::Polyline<2L>_>)
         RVar2.m_entry.
         super___shared_ptr<anurbs::Entry<anurbs::Polyline<2L>_>,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static Ref<TData> replace_with_key(TModel& self, const std::string& key,
        Pointer<TData> data)
    {
        return self.template replace<TData>(key, data);
    }